

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-gear.c
# Opt level: O0

object * gear_object_for_use(player *p,object *obj,wchar_t num,_Bool message,_Bool *none_left)

{
  char cVar1;
  _Bool _Var2;
  int16_t iVar3;
  bool bVar4;
  wchar_t local_94;
  ushort local_8e;
  ushort local_8c;
  char local_88 [2];
  uint16_t total_1;
  uint16_t total;
  _Bool artifact;
  char label;
  char name [80];
  object *first_remainder;
  object *usable;
  _Bool *none_left_local;
  _Bool message_local;
  wchar_t num_local;
  object *obj_local;
  player *p_local;
  
  name[0x48] = '\0';
  name[0x49] = '\0';
  name[0x4a] = '\0';
  name[0x4b] = '\0';
  name[0x4c] = '\0';
  name[0x4d] = '\0';
  name[0x4e] = '\0';
  name[0x4f] = '\0';
  cVar1 = gear_to_label(p,obj);
  bVar4 = obj->known->artifact == (artifact *)0x0;
  local_94 = num;
  if ((int)(uint)obj->number < num) {
    local_94 = (wchar_t)obj->number;
  }
  if (local_94 < (int)(uint)obj->number) {
    first_remainder = object_split(obj,local_94);
    iVar3 = object_weight_one(obj);
    p->upkeep->total_weight = p->upkeep->total_weight - local_94 * iVar3;
    if (message) {
      _Var2 = object_is_equipped(p->body,obj);
      if (((_Var2) || (_Var2 = tval_can_have_charges(obj), _Var2)) ||
         ((_Var2 = tval_is_rod(obj), _Var2 || (0 < obj->timeout)))) {
        local_8c = (ushort)obj->number;
      }
      else {
        local_8c = object_pack_total(p,obj,false,(object **)(name + 0x48));
        if (local_8c < *(byte *)(name._72_8_ + 0x12a)) {
          __assert_fail("total >= first_remainder->number",
                        "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-gear.c"
                        ,0x231,
                        "struct object *gear_object_for_use(struct player *, struct object *, int, _Bool, _Bool *)"
                       );
        }
        if (local_8c == *(byte *)(name._72_8_ + 0x12a)) {
          name[0x48] = '\0';
          name[0x49] = '\0';
          name[0x4a] = '\0';
          name[0x4b] = '\0';
          name[0x4c] = '\0';
          name[0x4d] = '\0';
          name[0x4e] = '\0';
          name[0x4f] = '\0';
        }
      }
      object_desc(local_88,0x50,obj,(uint)local_8c << 0x10 | 0x443,p);
    }
  }
  else {
    if (message) {
      if (bVar4) {
        _Var2 = object_is_equipped(p->body,obj);
        if ((((_Var2) || (_Var2 = tval_can_have_charges(obj), _Var2)) ||
            (_Var2 = tval_is_rod(obj), _Var2)) || (0 < obj->timeout)) {
          local_8e = (ushort)obj->number;
        }
        else {
          local_8e = object_pack_total(p,obj,false,(object **)(name + 0x48));
        }
        if ((int)(uint)local_8e < local_94) {
          __assert_fail("total >= num",
                        "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-gear.c"
                        ,0x250,
                        "struct object *gear_object_for_use(struct player *, struct object *, int, _Bool, _Bool *)"
                       );
        }
        local_8e = local_8e - (short)local_94;
        if ((local_8e == 0) || (local_8e <= *(byte *)(name._72_8_ + 0x12a))) {
          name[0x48] = '\0';
          name[0x49] = '\0';
          name[0x4a] = '\0';
          name[0x4b] = '\0';
          name[0x4c] = '\0';
          name[0x4d] = '\0';
          name[0x4e] = '\0';
          name[0x4f] = '\0';
        }
        object_desc(local_88,0x50,obj,(uint)local_8e << 0x10 | 0x443,p);
      }
      else {
        object_desc(local_88,0x50,obj,0x13,p);
      }
    }
    gear_excise_object(p,obj);
    *none_left = true;
    _Var2 = tracked_object_is(p->upkeep,obj);
    if (_Var2) {
      track_object(p->upkeep,(object *)0x0);
    }
    cmd_disable_repeat();
    first_remainder = obj;
  }
  p->upkeep->update = p->upkeep->update | 1;
  p->upkeep->notice = p->upkeep->notice | 1;
  p->upkeep->redraw = p->upkeep->redraw | 0x60000;
  if (message) {
    if (bVar4) {
      if (name._72_8_ == 0) {
        msg("You have %s (%c).",local_88,(ulong)(uint)(int)cVar1);
      }
      else {
        cVar1 = gear_to_label(p,(object *)name._72_8_);
        msg("You have %s (1st %c).",local_88,(ulong)(uint)(int)cVar1);
      }
    }
    else {
      msg("You no longer have the %s (%c).",local_88,(ulong)(uint)(int)cVar1);
    }
  }
  return first_remainder;
}

Assistant:

struct object *gear_object_for_use(struct player *p, struct object *obj,
	int num, bool message, bool *none_left)
{
	struct object *usable;
	struct object *first_remainder = NULL;
	char name[80];
	char label = gear_to_label(p, obj);
	bool artifact = (obj->known->artifact != NULL);

	/* Bounds check */
	num = MIN(num, obj->number);

	/* Split off a usable object if necessary */
	if (obj->number > num) {
		usable = object_split(obj, num);

		/* Change the weight */
		p->upkeep->total_weight -= num * object_weight_one(obj);

		if (message) {
			uint16_t total;

			/*
			 * Don't show aggregate total in pack if equipped or
			 * if the description could have a number of charges
			 * or recharging notice specific to the stack (not
			 * aggregating those quantities so there would be
			 * confusion if aggregating the count).
			 */
			if (object_is_equipped(p->body, obj)
					|| tval_can_have_charges(obj)
					|| tval_is_rod(obj)
					|| obj->timeout > 0) {
				total = obj->number;
			} else {
				total = object_pack_total(p, obj, false,
					&first_remainder);
				assert(total >= first_remainder->number);
				if (total == first_remainder->number) {
					first_remainder = NULL;
				}
			}
			object_desc(name, sizeof(name), obj,
				ODESC_PREFIX | ODESC_FULL | ODESC_ALTNUM |
				(total << 16), p);
		}
	} else {
		if (message) {
			if (artifact) {
				object_desc(name, sizeof(name), obj,
					ODESC_FULL | ODESC_SINGULAR, p);
			} else {
				uint16_t total;

				/*
				 * Use same logic as above for showing an
				 * aggregate total.
				 */
				if (object_is_equipped(p->body, obj)
						|| tval_can_have_charges(obj)
						|| tval_is_rod(obj)
						|| obj->timeout > 0) {
					total = obj->number;
				} else {
					total = object_pack_total(p, obj,
						false, &first_remainder);
				}

				assert(total >= num);
				total -= num;
				if (!total || total <= first_remainder->number) {
					first_remainder = NULL;
				}
				object_desc(name, sizeof(name), obj,
					ODESC_PREFIX | ODESC_FULL |
					ODESC_ALTNUM | (total << 16), p);
			}
		}

		/* We're using the entire stack */
		usable = obj;
		gear_excise_object(p, usable);
		*none_left = true;

		/* Stop tracking item */
		if (tracked_object_is(p->upkeep, obj))
			track_object(p->upkeep, NULL);

		/* Inventory has changed, so disable repeat command */
		cmd_disable_repeat();
	}

	/* Housekeeping */
	p->upkeep->update |= (PU_BONUS);
	p->upkeep->notice |= (PN_COMBINE);
	p->upkeep->redraw |= (PR_INVEN | PR_EQUIP);

	/* Print a message if desired */
	if (message) {
		if (artifact) {
			msg("You no longer have the %s (%c).", name, label);
		} else if (first_remainder) {
			label = gear_to_label(p, first_remainder);
			msg("You have %s (1st %c).", name, label);
		} else {
			msg("You have %s (%c).", name, label);
		}
	}

	return usable;
}